

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<Edge> * __thiscall vector<Edge>::operator=(vector<Edge> *this,vector<Edge> *other)

{
  uint uVar1;
  int iVar2;
  Edge *pEVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = other->_size;
  this->_size = uVar1;
  iVar2 = other->_capacity;
  uVar9 = (ulong)iVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  uVar5 = SUB168(auVar4 * ZEXT816(0xc),0);
  uVar6 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar6 = 0xffffffffffffffff;
  }
  this->_capacity = iVar2;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0xc),8) == 0) {
    uVar5 = uVar6;
  }
  puVar7 = (ulong *)operator_new__(uVar5);
  *puVar7 = uVar9;
  if (iVar2 != 0) {
    memset((Edge *)(puVar7 + 1),0,((uVar9 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  this->vect = (Edge *)(puVar7 + 1);
  if (0 < (int)uVar1) {
    pEVar3 = other->vect;
    lVar8 = 0;
    do {
      *(undefined4 *)((long)puVar7 + lVar8 + 8) = *(undefined4 *)((long)&pEVar3->_nodeS + lVar8);
      *(undefined4 *)((long)puVar7 + lVar8 + 0xc) = *(undefined4 *)((long)&pEVar3->_nodeD + lVar8);
      *(undefined4 *)((long)puVar7 + lVar8 + 0x10) = *(undefined4 *)((long)&pEVar3->_cost + lVar8);
      lVar8 = lVar8 + 0xc;
    } while ((ulong)uVar1 * 0xc != lVar8);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }